

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<cv::Mat> *
testing::internal::ActionResultHolder<cv::Mat>::PerformAction<cv::Mat(std::__cxx11::string)>
          (Action<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
           *action,ArgumentTuple *args)

{
  ActionResultHolder<cv::Mat> *this;
  Action<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_d8 [6];
  ReferenceOrValueWrapper<cv::Mat> local_78;
  ArgumentTuple *local_18;
  ArgumentTuple *args_local;
  Action<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this = (ActionResultHolder<cv::Mat> *)operator_new(0x68);
  Action<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::Perform(local_d8,args_local);
  ReferenceOrValueWrapper<cv::Mat>::ReferenceOrValueWrapper(&local_78,(Mat *)local_d8);
  ActionResultHolder(this,&local_78);
  ReferenceOrValueWrapper<cv::Mat>::~ReferenceOrValueWrapper(&local_78);
  cv::Mat::~Mat((Mat *)local_d8);
  return this;
}

Assistant:

static ActionResultHolder*
  PerformAction(const Action<F>& action,
                const typename Function<F>::ArgumentTuple& args) {
    return new ActionResultHolder(Wrapper(action.Perform(args)));
  }